

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_reporter_console.hpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  char *pcVar1;
  ostream *poVar2;
  Colour local_19;
  string *psStack_18;
  Colour colourGuard;
  string *_name_local;
  ConsoleReporter *this_local;
  
  poVar2 = (this->super_StreamingReporterBase).stream;
  psStack_18 = _name;
  pcVar1 = getLineOfChars<(char)45>();
  poVar2 = std::operator<<(poVar2,pcVar1);
  std::operator<<(poVar2,"\n");
  Colour::Colour(&local_19,Headers);
  printHeaderString(this,psStack_18,0);
  Colour::~Colour(&local_19);
  return;
}

Assistant:

void printOpenHeader( std::string const& _name ) {
            stream  << getLineOfChars<'-'>() << "\n";
            {
                Colour colourGuard( Colour::Headers );
                printHeaderString( _name );
            }
        }